

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_5x5_pack8.h
# Opt level: O0

void ncnn::convdw5x5s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m256 _k44;
  __m256 _k43;
  __m256 _k42;
  __m256 _k41;
  __m256 _k40;
  __m256 _r44;
  __m256 _r43;
  __m256 _r42;
  __m256 _r41;
  __m256 _r40;
  __m256 _k34;
  __m256 _k33;
  __m256 _k32;
  __m256 _k31;
  __m256 _k30;
  __m256 _r34;
  __m256 _r33;
  __m256 _r32;
  __m256 _r31;
  __m256 _r30;
  __m256 _k24;
  __m256 _k23;
  __m256 _k22;
  __m256 _k21;
  __m256 _k20;
  __m256 _r24;
  __m256 _r23;
  __m256 _r22;
  __m256 _r21;
  __m256 _r20;
  __m256 _k14;
  __m256 _k13;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _r14;
  __m256 _r13;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _k04;
  __m256 _k03;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  __m256 _r04;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum0;
  int j;
  int i;
  float *r4;
  float *r3;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m256 _bias0;
  Mat out;
  int g;
  float *bias;
  int group;
  int outh;
  int outw;
  Mat *m;
  Mat *m_1;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  int local_1b78;
  int local_1b74;
  undefined8 *local_1b70;
  undefined8 *local_1b68;
  undefined8 *local_1b60;
  undefined8 *local_1b58;
  undefined8 *local_1b50;
  undefined8 *local_1b00;
  int local_1a64;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float fStack_18c4;
  float local_1880;
  float fStack_187c;
  float fStack_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float fStack_1868;
  float fStack_1864;
  float local_1820;
  float fStack_181c;
  float fStack_1818;
  float fStack_1814;
  float fStack_1810;
  float fStack_180c;
  float fStack_1808;
  float fStack_1804;
  float local_17c0;
  float fStack_17bc;
  float fStack_17b8;
  float fStack_17b4;
  float fStack_17b0;
  float fStack_17ac;
  float fStack_17a8;
  float fStack_17a4;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  float local_1700;
  float fStack_16fc;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  float local_16a0;
  float fStack_169c;
  float fStack_1698;
  float fStack_1694;
  float fStack_1690;
  float fStack_168c;
  float fStack_1688;
  float fStack_1684;
  float local_1640;
  float fStack_163c;
  float fStack_1638;
  float fStack_1634;
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  float fStack_1624;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  float local_1580;
  float fStack_157c;
  float fStack_1578;
  float fStack_1574;
  float fStack_1570;
  float fStack_156c;
  float fStack_1568;
  float fStack_1564;
  float local_1520;
  float fStack_151c;
  float fStack_1518;
  float fStack_1514;
  float fStack_1510;
  float fStack_150c;
  float fStack_1508;
  float fStack_1504;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float fStack_1450;
  float fStack_144c;
  float fStack_1448;
  float fStack_1444;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_13a0;
  float fStack_139c;
  float fStack_1398;
  float fStack_1394;
  float fStack_1390;
  float fStack_138c;
  float fStack_1388;
  float fStack_1384;
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float fStack_1324;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float fStack_12c4;
  float local_1280;
  float fStack_127c;
  float fStack_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  float fStack_1268;
  float fStack_1264;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  float local_11c0;
  float fStack_11bc;
  float fStack_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  float fStack_1144;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float fStack_10e4;
  float local_10a0;
  float fStack_109c;
  float fStack_1098;
  float fStack_1094;
  float fStack_1090;
  float fStack_108c;
  float fStack_1088;
  float fStack_1084;
  float local_1040;
  float fStack_103c;
  float fStack_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float fStack_1028;
  float fStack_1024;
  float local_fe0;
  float fStack_fdc;
  float fStack_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float fStack_fc8;
  float fStack_fc4;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar5 = in_RSI[6];
  lVar6 = in_RDI[7];
  lVar3 = *in_RCX;
  for (local_1a64 = 0; local_1a64 < (int)lVar6; local_1a64 = local_1a64 + 1) {
    local_1b00 = (undefined8 *)(*in_RSI + in_RSI[8] * (long)local_1a64 * in_RSI[2]);
    if (lVar3 == 0) {
      local_2240 = 0;
      uStack_2238 = 0;
      uStack_2230 = 0;
      uStack_2228 = 0;
    }
    else {
      puVar7 = (undefined8 *)(lVar3 + (long)(local_1a64 << 3) * 4);
      local_2240 = *puVar7;
      uStack_2238 = puVar7[1];
      uStack_2230 = puVar7[2];
      uStack_2228 = puVar7[3];
    }
    puVar7 = (undefined8 *)
             (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_1a64 * in_RDX[2]);
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    local_1b50 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_1a64 * in_RDI[2]);
    lVar4 = in_RDI[2];
    local_1b58 = (undefined8 *)((long)local_1b50 + iVar2 * lVar4);
    local_1b60 = (undefined8 *)((long)local_1b50 + (long)iVar2 * 2 * lVar4);
    local_1b68 = (undefined8 *)((long)local_1b50 + (long)iVar2 * 3 * lVar4);
    local_1b70 = (undefined8 *)((long)local_1b50 + (long)iVar2 * 4 * lVar4);
    for (local_1b74 = 0; local_1b74 < (int)lVar5; local_1b74 = local_1b74 + 1) {
      for (local_1b78 = 0; local_1b78 < iVar1; local_1b78 = local_1b78 + 1) {
        local_fe0 = (float)*puVar7;
        fStack_fdc = (float)((ulong)*puVar7 >> 0x20);
        fStack_fd8 = (float)puVar7[1];
        fStack_fd4 = (float)((ulong)puVar7[1] >> 0x20);
        fStack_fd0 = (float)puVar7[2];
        fStack_fcc = (float)((ulong)puVar7[2] >> 0x20);
        fStack_fc8 = (float)puVar7[3];
        fStack_fc4 = (float)((ulong)puVar7[3] >> 0x20);
        local_680 = (float)*local_1b50;
        fStack_67c = (float)((ulong)*local_1b50 >> 0x20);
        fStack_678 = (float)local_1b50[1];
        fStack_674 = (float)((ulong)local_1b50[1] >> 0x20);
        fStack_670 = (float)local_1b50[2];
        fStack_66c = (float)((ulong)local_1b50[2] >> 0x20);
        fStack_668 = (float)local_1b50[3];
        local_cc0 = (float)local_2240;
        fStack_cbc = (float)((ulong)local_2240 >> 0x20);
        fStack_cb8 = (float)uStack_2238;
        fStack_cb4 = (float)((ulong)uStack_2238 >> 0x20);
        fStack_cb0 = (float)uStack_2230;
        fStack_cac = (float)((ulong)uStack_2230 >> 0x20);
        fStack_ca8 = (float)uStack_2228;
        fStack_ca4 = (float)((ulong)uStack_2228 >> 0x20);
        local_1040 = (float)puVar7[4];
        fStack_103c = (float)((ulong)puVar7[4] >> 0x20);
        fStack_1038 = (float)puVar7[5];
        fStack_1034 = (float)((ulong)puVar7[5] >> 0x20);
        fStack_1030 = (float)puVar7[6];
        fStack_102c = (float)((ulong)puVar7[6] >> 0x20);
        fStack_1028 = (float)puVar7[7];
        fStack_1024 = (float)((ulong)puVar7[7] >> 0x20);
        local_640 = (float)local_1b50[4];
        fStack_63c = (float)((ulong)local_1b50[4] >> 0x20);
        fStack_638 = (float)local_1b50[5];
        fStack_634 = (float)((ulong)local_1b50[5] >> 0x20);
        fStack_630 = (float)local_1b50[6];
        fStack_62c = (float)((ulong)local_1b50[6] >> 0x20);
        fStack_628 = (float)local_1b50[7];
        local_10a0 = (float)puVar7[8];
        fStack_109c = (float)((ulong)puVar7[8] >> 0x20);
        fStack_1098 = (float)puVar7[9];
        fStack_1094 = (float)((ulong)puVar7[9] >> 0x20);
        fStack_1090 = (float)puVar7[10];
        fStack_108c = (float)((ulong)puVar7[10] >> 0x20);
        fStack_1088 = (float)puVar7[0xb];
        fStack_1084 = (float)((ulong)puVar7[0xb] >> 0x20);
        local_600 = (float)local_1b50[8];
        fStack_5fc = (float)((ulong)local_1b50[8] >> 0x20);
        fStack_5f8 = (float)local_1b50[9];
        fStack_5f4 = (float)((ulong)local_1b50[9] >> 0x20);
        fStack_5f0 = (float)local_1b50[10];
        fStack_5ec = (float)((ulong)local_1b50[10] >> 0x20);
        fStack_5e8 = (float)local_1b50[0xb];
        local_1100 = (float)puVar7[0xc];
        fStack_10fc = (float)((ulong)puVar7[0xc] >> 0x20);
        fStack_10f8 = (float)puVar7[0xd];
        fStack_10f4 = (float)((ulong)puVar7[0xd] >> 0x20);
        fStack_10f0 = (float)puVar7[0xe];
        fStack_10ec = (float)((ulong)puVar7[0xe] >> 0x20);
        fStack_10e8 = (float)puVar7[0xf];
        fStack_10e4 = (float)((ulong)puVar7[0xf] >> 0x20);
        local_5c0 = (float)local_1b50[0xc];
        fStack_5bc = (float)((ulong)local_1b50[0xc] >> 0x20);
        fStack_5b8 = (float)local_1b50[0xd];
        fStack_5b4 = (float)((ulong)local_1b50[0xd] >> 0x20);
        fStack_5b0 = (float)local_1b50[0xe];
        fStack_5ac = (float)((ulong)local_1b50[0xe] >> 0x20);
        fStack_5a8 = (float)local_1b50[0xf];
        local_1160 = (float)puVar7[0x10];
        fStack_115c = (float)((ulong)puVar7[0x10] >> 0x20);
        fStack_1158 = (float)puVar7[0x11];
        fStack_1154 = (float)((ulong)puVar7[0x11] >> 0x20);
        fStack_1150 = (float)puVar7[0x12];
        fStack_114c = (float)((ulong)puVar7[0x12] >> 0x20);
        fStack_1148 = (float)puVar7[0x13];
        fStack_1144 = (float)((ulong)puVar7[0x13] >> 0x20);
        local_580 = (float)local_1b50[0x10];
        fStack_57c = (float)((ulong)local_1b50[0x10] >> 0x20);
        fStack_578 = (float)local_1b50[0x11];
        fStack_574 = (float)((ulong)local_1b50[0x11] >> 0x20);
        fStack_570 = (float)local_1b50[0x12];
        fStack_56c = (float)((ulong)local_1b50[0x12] >> 0x20);
        fStack_568 = (float)local_1b50[0x13];
        local_11c0 = (float)puVar7[0x14];
        fStack_11bc = (float)((ulong)puVar7[0x14] >> 0x20);
        fStack_11b8 = (float)puVar7[0x15];
        fStack_11b4 = (float)((ulong)puVar7[0x15] >> 0x20);
        fStack_11b0 = (float)puVar7[0x16];
        fStack_11ac = (float)((ulong)puVar7[0x16] >> 0x20);
        fStack_11a8 = (float)puVar7[0x17];
        fStack_11a4 = (float)((ulong)puVar7[0x17] >> 0x20);
        local_540 = (float)*local_1b58;
        fStack_53c = (float)((ulong)*local_1b58 >> 0x20);
        fStack_538 = (float)local_1b58[1];
        fStack_534 = (float)((ulong)local_1b58[1] >> 0x20);
        fStack_530 = (float)local_1b58[2];
        fStack_52c = (float)((ulong)local_1b58[2] >> 0x20);
        fStack_528 = (float)local_1b58[3];
        local_1220 = (float)puVar7[0x18];
        fStack_121c = (float)((ulong)puVar7[0x18] >> 0x20);
        fStack_1218 = (float)puVar7[0x19];
        fStack_1214 = (float)((ulong)puVar7[0x19] >> 0x20);
        fStack_1210 = (float)puVar7[0x1a];
        fStack_120c = (float)((ulong)puVar7[0x1a] >> 0x20);
        fStack_1208 = (float)puVar7[0x1b];
        fStack_1204 = (float)((ulong)puVar7[0x1b] >> 0x20);
        local_500 = (float)local_1b58[4];
        fStack_4fc = (float)((ulong)local_1b58[4] >> 0x20);
        fStack_4f8 = (float)local_1b58[5];
        fStack_4f4 = (float)((ulong)local_1b58[5] >> 0x20);
        fStack_4f0 = (float)local_1b58[6];
        fStack_4ec = (float)((ulong)local_1b58[6] >> 0x20);
        fStack_4e8 = (float)local_1b58[7];
        local_1280 = (float)puVar7[0x1c];
        fStack_127c = (float)((ulong)puVar7[0x1c] >> 0x20);
        fStack_1278 = (float)puVar7[0x1d];
        fStack_1274 = (float)((ulong)puVar7[0x1d] >> 0x20);
        fStack_1270 = (float)puVar7[0x1e];
        fStack_126c = (float)((ulong)puVar7[0x1e] >> 0x20);
        fStack_1268 = (float)puVar7[0x1f];
        fStack_1264 = (float)((ulong)puVar7[0x1f] >> 0x20);
        local_4c0 = (float)local_1b58[8];
        fStack_4bc = (float)((ulong)local_1b58[8] >> 0x20);
        fStack_4b8 = (float)local_1b58[9];
        fStack_4b4 = (float)((ulong)local_1b58[9] >> 0x20);
        fStack_4b0 = (float)local_1b58[10];
        fStack_4ac = (float)((ulong)local_1b58[10] >> 0x20);
        fStack_4a8 = (float)local_1b58[0xb];
        local_12e0 = (float)puVar7[0x20];
        fStack_12dc = (float)((ulong)puVar7[0x20] >> 0x20);
        fStack_12d8 = (float)puVar7[0x21];
        fStack_12d4 = (float)((ulong)puVar7[0x21] >> 0x20);
        fStack_12d0 = (float)puVar7[0x22];
        fStack_12cc = (float)((ulong)puVar7[0x22] >> 0x20);
        fStack_12c8 = (float)puVar7[0x23];
        fStack_12c4 = (float)((ulong)puVar7[0x23] >> 0x20);
        local_480 = (float)local_1b58[0xc];
        fStack_47c = (float)((ulong)local_1b58[0xc] >> 0x20);
        fStack_478 = (float)local_1b58[0xd];
        fStack_474 = (float)((ulong)local_1b58[0xd] >> 0x20);
        fStack_470 = (float)local_1b58[0xe];
        fStack_46c = (float)((ulong)local_1b58[0xe] >> 0x20);
        fStack_468 = (float)local_1b58[0xf];
        local_1340 = (float)puVar7[0x24];
        fStack_133c = (float)((ulong)puVar7[0x24] >> 0x20);
        fStack_1338 = (float)puVar7[0x25];
        fStack_1334 = (float)((ulong)puVar7[0x25] >> 0x20);
        fStack_1330 = (float)puVar7[0x26];
        fStack_132c = (float)((ulong)puVar7[0x26] >> 0x20);
        fStack_1328 = (float)puVar7[0x27];
        fStack_1324 = (float)((ulong)puVar7[0x27] >> 0x20);
        local_440 = (float)local_1b58[0x10];
        fStack_43c = (float)((ulong)local_1b58[0x10] >> 0x20);
        fStack_438 = (float)local_1b58[0x11];
        fStack_434 = (float)((ulong)local_1b58[0x11] >> 0x20);
        fStack_430 = (float)local_1b58[0x12];
        fStack_42c = (float)((ulong)local_1b58[0x12] >> 0x20);
        fStack_428 = (float)local_1b58[0x13];
        local_13a0 = (float)puVar7[0x28];
        fStack_139c = (float)((ulong)puVar7[0x28] >> 0x20);
        fStack_1398 = (float)puVar7[0x29];
        fStack_1394 = (float)((ulong)puVar7[0x29] >> 0x20);
        fStack_1390 = (float)puVar7[0x2a];
        fStack_138c = (float)((ulong)puVar7[0x2a] >> 0x20);
        fStack_1388 = (float)puVar7[0x2b];
        fStack_1384 = (float)((ulong)puVar7[0x2b] >> 0x20);
        local_400 = (float)*local_1b60;
        fStack_3fc = (float)((ulong)*local_1b60 >> 0x20);
        fStack_3f8 = (float)local_1b60[1];
        fStack_3f4 = (float)((ulong)local_1b60[1] >> 0x20);
        fStack_3f0 = (float)local_1b60[2];
        fStack_3ec = (float)((ulong)local_1b60[2] >> 0x20);
        fStack_3e8 = (float)local_1b60[3];
        local_1400 = (float)puVar7[0x2c];
        fStack_13fc = (float)((ulong)puVar7[0x2c] >> 0x20);
        fStack_13f8 = (float)puVar7[0x2d];
        fStack_13f4 = (float)((ulong)puVar7[0x2d] >> 0x20);
        fStack_13f0 = (float)puVar7[0x2e];
        fStack_13ec = (float)((ulong)puVar7[0x2e] >> 0x20);
        fStack_13e8 = (float)puVar7[0x2f];
        fStack_13e4 = (float)((ulong)puVar7[0x2f] >> 0x20);
        local_3c0 = (float)local_1b60[4];
        fStack_3bc = (float)((ulong)local_1b60[4] >> 0x20);
        fStack_3b8 = (float)local_1b60[5];
        fStack_3b4 = (float)((ulong)local_1b60[5] >> 0x20);
        fStack_3b0 = (float)local_1b60[6];
        fStack_3ac = (float)((ulong)local_1b60[6] >> 0x20);
        fStack_3a8 = (float)local_1b60[7];
        local_1460 = (float)puVar7[0x30];
        fStack_145c = (float)((ulong)puVar7[0x30] >> 0x20);
        fStack_1458 = (float)puVar7[0x31];
        fStack_1454 = (float)((ulong)puVar7[0x31] >> 0x20);
        fStack_1450 = (float)puVar7[0x32];
        fStack_144c = (float)((ulong)puVar7[0x32] >> 0x20);
        fStack_1448 = (float)puVar7[0x33];
        fStack_1444 = (float)((ulong)puVar7[0x33] >> 0x20);
        local_380 = (float)local_1b60[8];
        fStack_37c = (float)((ulong)local_1b60[8] >> 0x20);
        fStack_378 = (float)local_1b60[9];
        fStack_374 = (float)((ulong)local_1b60[9] >> 0x20);
        fStack_370 = (float)local_1b60[10];
        fStack_36c = (float)((ulong)local_1b60[10] >> 0x20);
        fStack_368 = (float)local_1b60[0xb];
        local_14c0 = (float)puVar7[0x34];
        fStack_14bc = (float)((ulong)puVar7[0x34] >> 0x20);
        fStack_14b8 = (float)puVar7[0x35];
        fStack_14b4 = (float)((ulong)puVar7[0x35] >> 0x20);
        fStack_14b0 = (float)puVar7[0x36];
        fStack_14ac = (float)((ulong)puVar7[0x36] >> 0x20);
        fStack_14a8 = (float)puVar7[0x37];
        fStack_14a4 = (float)((ulong)puVar7[0x37] >> 0x20);
        local_340 = (float)local_1b60[0xc];
        fStack_33c = (float)((ulong)local_1b60[0xc] >> 0x20);
        fStack_338 = (float)local_1b60[0xd];
        fStack_334 = (float)((ulong)local_1b60[0xd] >> 0x20);
        fStack_330 = (float)local_1b60[0xe];
        fStack_32c = (float)((ulong)local_1b60[0xe] >> 0x20);
        fStack_328 = (float)local_1b60[0xf];
        local_1520 = (float)puVar7[0x38];
        fStack_151c = (float)((ulong)puVar7[0x38] >> 0x20);
        fStack_1518 = (float)puVar7[0x39];
        fStack_1514 = (float)((ulong)puVar7[0x39] >> 0x20);
        fStack_1510 = (float)puVar7[0x3a];
        fStack_150c = (float)((ulong)puVar7[0x3a] >> 0x20);
        fStack_1508 = (float)puVar7[0x3b];
        fStack_1504 = (float)((ulong)puVar7[0x3b] >> 0x20);
        local_300 = (float)local_1b60[0x10];
        fStack_2fc = (float)((ulong)local_1b60[0x10] >> 0x20);
        fStack_2f8 = (float)local_1b60[0x11];
        fStack_2f4 = (float)((ulong)local_1b60[0x11] >> 0x20);
        fStack_2f0 = (float)local_1b60[0x12];
        fStack_2ec = (float)((ulong)local_1b60[0x12] >> 0x20);
        fStack_2e8 = (float)local_1b60[0x13];
        local_1580 = (float)puVar7[0x3c];
        fStack_157c = (float)((ulong)puVar7[0x3c] >> 0x20);
        fStack_1578 = (float)puVar7[0x3d];
        fStack_1574 = (float)((ulong)puVar7[0x3d] >> 0x20);
        fStack_1570 = (float)puVar7[0x3e];
        fStack_156c = (float)((ulong)puVar7[0x3e] >> 0x20);
        fStack_1568 = (float)puVar7[0x3f];
        fStack_1564 = (float)((ulong)puVar7[0x3f] >> 0x20);
        local_2c0 = (float)*local_1b68;
        fStack_2bc = (float)((ulong)*local_1b68 >> 0x20);
        fStack_2b8 = (float)local_1b68[1];
        fStack_2b4 = (float)((ulong)local_1b68[1] >> 0x20);
        fStack_2b0 = (float)local_1b68[2];
        fStack_2ac = (float)((ulong)local_1b68[2] >> 0x20);
        fStack_2a8 = (float)local_1b68[3];
        local_15e0 = (float)puVar7[0x40];
        fStack_15dc = (float)((ulong)puVar7[0x40] >> 0x20);
        fStack_15d8 = (float)puVar7[0x41];
        fStack_15d4 = (float)((ulong)puVar7[0x41] >> 0x20);
        fStack_15d0 = (float)puVar7[0x42];
        fStack_15cc = (float)((ulong)puVar7[0x42] >> 0x20);
        fStack_15c8 = (float)puVar7[0x43];
        fStack_15c4 = (float)((ulong)puVar7[0x43] >> 0x20);
        local_280 = (float)local_1b68[4];
        fStack_27c = (float)((ulong)local_1b68[4] >> 0x20);
        fStack_278 = (float)local_1b68[5];
        fStack_274 = (float)((ulong)local_1b68[5] >> 0x20);
        fStack_270 = (float)local_1b68[6];
        fStack_26c = (float)((ulong)local_1b68[6] >> 0x20);
        fStack_268 = (float)local_1b68[7];
        local_1640 = (float)puVar7[0x44];
        fStack_163c = (float)((ulong)puVar7[0x44] >> 0x20);
        fStack_1638 = (float)puVar7[0x45];
        fStack_1634 = (float)((ulong)puVar7[0x45] >> 0x20);
        fStack_1630 = (float)puVar7[0x46];
        fStack_162c = (float)((ulong)puVar7[0x46] >> 0x20);
        fStack_1628 = (float)puVar7[0x47];
        fStack_1624 = (float)((ulong)puVar7[0x47] >> 0x20);
        local_240 = (float)local_1b68[8];
        fStack_23c = (float)((ulong)local_1b68[8] >> 0x20);
        fStack_238 = (float)local_1b68[9];
        fStack_234 = (float)((ulong)local_1b68[9] >> 0x20);
        fStack_230 = (float)local_1b68[10];
        fStack_22c = (float)((ulong)local_1b68[10] >> 0x20);
        fStack_228 = (float)local_1b68[0xb];
        local_16a0 = (float)puVar7[0x48];
        fStack_169c = (float)((ulong)puVar7[0x48] >> 0x20);
        fStack_1698 = (float)puVar7[0x49];
        fStack_1694 = (float)((ulong)puVar7[0x49] >> 0x20);
        fStack_1690 = (float)puVar7[0x4a];
        fStack_168c = (float)((ulong)puVar7[0x4a] >> 0x20);
        fStack_1688 = (float)puVar7[0x4b];
        fStack_1684 = (float)((ulong)puVar7[0x4b] >> 0x20);
        local_200 = (float)local_1b68[0xc];
        fStack_1fc = (float)((ulong)local_1b68[0xc] >> 0x20);
        fStack_1f8 = (float)local_1b68[0xd];
        fStack_1f4 = (float)((ulong)local_1b68[0xd] >> 0x20);
        fStack_1f0 = (float)local_1b68[0xe];
        fStack_1ec = (float)((ulong)local_1b68[0xe] >> 0x20);
        fStack_1e8 = (float)local_1b68[0xf];
        local_1700 = (float)puVar7[0x4c];
        fStack_16fc = (float)((ulong)puVar7[0x4c] >> 0x20);
        fStack_16f8 = (float)puVar7[0x4d];
        fStack_16f4 = (float)((ulong)puVar7[0x4d] >> 0x20);
        fStack_16f0 = (float)puVar7[0x4e];
        fStack_16ec = (float)((ulong)puVar7[0x4e] >> 0x20);
        fStack_16e8 = (float)puVar7[0x4f];
        fStack_16e4 = (float)((ulong)puVar7[0x4f] >> 0x20);
        local_1c0 = (float)local_1b68[0x10];
        fStack_1bc = (float)((ulong)local_1b68[0x10] >> 0x20);
        fStack_1b8 = (float)local_1b68[0x11];
        fStack_1b4 = (float)((ulong)local_1b68[0x11] >> 0x20);
        fStack_1b0 = (float)local_1b68[0x12];
        fStack_1ac = (float)((ulong)local_1b68[0x12] >> 0x20);
        fStack_1a8 = (float)local_1b68[0x13];
        local_1760 = (float)puVar7[0x50];
        fStack_175c = (float)((ulong)puVar7[0x50] >> 0x20);
        fStack_1758 = (float)puVar7[0x51];
        fStack_1754 = (float)((ulong)puVar7[0x51] >> 0x20);
        fStack_1750 = (float)puVar7[0x52];
        fStack_174c = (float)((ulong)puVar7[0x52] >> 0x20);
        fStack_1748 = (float)puVar7[0x53];
        fStack_1744 = (float)((ulong)puVar7[0x53] >> 0x20);
        local_180 = (float)*local_1b70;
        fStack_17c = (float)((ulong)*local_1b70 >> 0x20);
        fStack_178 = (float)local_1b70[1];
        fStack_174 = (float)((ulong)local_1b70[1] >> 0x20);
        fStack_170 = (float)local_1b70[2];
        fStack_16c = (float)((ulong)local_1b70[2] >> 0x20);
        fStack_168 = (float)local_1b70[3];
        local_17c0 = (float)puVar7[0x54];
        fStack_17bc = (float)((ulong)puVar7[0x54] >> 0x20);
        fStack_17b8 = (float)puVar7[0x55];
        fStack_17b4 = (float)((ulong)puVar7[0x55] >> 0x20);
        fStack_17b0 = (float)puVar7[0x56];
        fStack_17ac = (float)((ulong)puVar7[0x56] >> 0x20);
        fStack_17a8 = (float)puVar7[0x57];
        fStack_17a4 = (float)((ulong)puVar7[0x57] >> 0x20);
        local_140 = (float)local_1b70[4];
        fStack_13c = (float)((ulong)local_1b70[4] >> 0x20);
        fStack_138 = (float)local_1b70[5];
        fStack_134 = (float)((ulong)local_1b70[5] >> 0x20);
        fStack_130 = (float)local_1b70[6];
        fStack_12c = (float)((ulong)local_1b70[6] >> 0x20);
        fStack_128 = (float)local_1b70[7];
        local_1820 = (float)puVar7[0x58];
        fStack_181c = (float)((ulong)puVar7[0x58] >> 0x20);
        fStack_1818 = (float)puVar7[0x59];
        fStack_1814 = (float)((ulong)puVar7[0x59] >> 0x20);
        fStack_1810 = (float)puVar7[0x5a];
        fStack_180c = (float)((ulong)puVar7[0x5a] >> 0x20);
        fStack_1808 = (float)puVar7[0x5b];
        fStack_1804 = (float)((ulong)puVar7[0x5b] >> 0x20);
        local_100 = (float)local_1b70[8];
        fStack_fc = (float)((ulong)local_1b70[8] >> 0x20);
        fStack_f8 = (float)local_1b70[9];
        fStack_f4 = (float)((ulong)local_1b70[9] >> 0x20);
        fStack_f0 = (float)local_1b70[10];
        fStack_ec = (float)((ulong)local_1b70[10] >> 0x20);
        fStack_e8 = (float)local_1b70[0xb];
        local_1880 = (float)puVar7[0x5c];
        fStack_187c = (float)((ulong)puVar7[0x5c] >> 0x20);
        fStack_1878 = (float)puVar7[0x5d];
        fStack_1874 = (float)((ulong)puVar7[0x5d] >> 0x20);
        fStack_1870 = (float)puVar7[0x5e];
        fStack_186c = (float)((ulong)puVar7[0x5e] >> 0x20);
        fStack_1868 = (float)puVar7[0x5f];
        fStack_1864 = (float)((ulong)puVar7[0x5f] >> 0x20);
        local_c0 = (float)local_1b70[0xc];
        fStack_bc = (float)((ulong)local_1b70[0xc] >> 0x20);
        fStack_b8 = (float)local_1b70[0xd];
        fStack_b4 = (float)((ulong)local_1b70[0xd] >> 0x20);
        fStack_b0 = (float)local_1b70[0xe];
        fStack_ac = (float)((ulong)local_1b70[0xe] >> 0x20);
        fStack_a8 = (float)local_1b70[0xf];
        local_18e0 = (float)puVar7[0x60];
        fStack_18dc = (float)((ulong)puVar7[0x60] >> 0x20);
        fStack_18d8 = (float)puVar7[0x61];
        fStack_18d4 = (float)((ulong)puVar7[0x61] >> 0x20);
        fStack_18d0 = (float)puVar7[0x62];
        fStack_18cc = (float)((ulong)puVar7[0x62] >> 0x20);
        fStack_18c8 = (float)puVar7[99];
        fStack_18c4 = (float)((ulong)puVar7[99] >> 0x20);
        local_80 = (float)local_1b70[0x10];
        fStack_7c = (float)((ulong)local_1b70[0x10] >> 0x20);
        fStack_78 = (float)local_1b70[0x11];
        fStack_74 = (float)((ulong)local_1b70[0x11] >> 0x20);
        fStack_70 = (float)local_1b70[0x12];
        fStack_6c = (float)((ulong)local_1b70[0x12] >> 0x20);
        fStack_68 = (float)local_1b70[0x13];
        *local_1b00 = CONCAT44(fStack_18dc * fStack_7c +
                               fStack_187c * fStack_bc +
                               fStack_181c * fStack_fc +
                               fStack_17bc * fStack_13c +
                               fStack_175c * fStack_17c +
                               fStack_16fc * fStack_1bc +
                               fStack_169c * fStack_1fc +
                               fStack_163c * fStack_23c +
                               fStack_15dc * fStack_27c +
                               fStack_157c * fStack_2bc +
                               fStack_151c * fStack_2fc +
                               fStack_14bc * fStack_33c +
                               fStack_145c * fStack_37c +
                               fStack_13fc * fStack_3bc +
                               fStack_139c * fStack_3fc +
                               fStack_133c * fStack_43c +
                               fStack_12dc * fStack_47c +
                               fStack_127c * fStack_4bc +
                               fStack_121c * fStack_4fc +
                               fStack_11bc * fStack_53c +
                               fStack_115c * fStack_57c +
                               fStack_10fc * fStack_5bc +
                               fStack_109c * fStack_5fc +
                               fStack_103c * fStack_63c + fStack_fdc * fStack_67c + fStack_cbc,
                               local_18e0 * local_80 +
                               local_1880 * local_c0 +
                               local_1820 * local_100 +
                               local_17c0 * local_140 +
                               local_1760 * local_180 +
                               local_1700 * local_1c0 +
                               local_16a0 * local_200 +
                               local_1640 * local_240 +
                               local_15e0 * local_280 +
                               local_1580 * local_2c0 +
                               local_1520 * local_300 +
                               local_14c0 * local_340 +
                               local_1460 * local_380 +
                               local_1400 * local_3c0 +
                               local_13a0 * local_400 +
                               local_1340 * local_440 +
                               local_12e0 * local_480 +
                               local_1280 * local_4c0 +
                               local_1220 * local_500 +
                               local_11c0 * local_540 +
                               local_1160 * local_580 +
                               local_1100 * local_5c0 +
                               local_10a0 * local_600 +
                               local_1040 * local_640 + local_fe0 * local_680 + local_cc0);
        local_1b00[1] =
             CONCAT44(fStack_18d4 * fStack_74 +
                      fStack_1874 * fStack_b4 +
                      fStack_1814 * fStack_f4 +
                      fStack_17b4 * fStack_134 +
                      fStack_1754 * fStack_174 +
                      fStack_16f4 * fStack_1b4 +
                      fStack_1694 * fStack_1f4 +
                      fStack_1634 * fStack_234 +
                      fStack_15d4 * fStack_274 +
                      fStack_1574 * fStack_2b4 +
                      fStack_1514 * fStack_2f4 +
                      fStack_14b4 * fStack_334 +
                      fStack_1454 * fStack_374 +
                      fStack_13f4 * fStack_3b4 +
                      fStack_1394 * fStack_3f4 +
                      fStack_1334 * fStack_434 +
                      fStack_12d4 * fStack_474 +
                      fStack_1274 * fStack_4b4 +
                      fStack_1214 * fStack_4f4 +
                      fStack_11b4 * fStack_534 +
                      fStack_1154 * fStack_574 +
                      fStack_10f4 * fStack_5b4 +
                      fStack_1094 * fStack_5f4 +
                      fStack_1034 * fStack_634 + fStack_fd4 * fStack_674 + fStack_cb4,
                      fStack_18d8 * fStack_78 +
                      fStack_1878 * fStack_b8 +
                      fStack_1818 * fStack_f8 +
                      fStack_17b8 * fStack_138 +
                      fStack_1758 * fStack_178 +
                      fStack_16f8 * fStack_1b8 +
                      fStack_1698 * fStack_1f8 +
                      fStack_1638 * fStack_238 +
                      fStack_15d8 * fStack_278 +
                      fStack_1578 * fStack_2b8 +
                      fStack_1518 * fStack_2f8 +
                      fStack_14b8 * fStack_338 +
                      fStack_1458 * fStack_378 +
                      fStack_13f8 * fStack_3b8 +
                      fStack_1398 * fStack_3f8 +
                      fStack_1338 * fStack_438 +
                      fStack_12d8 * fStack_478 +
                      fStack_1278 * fStack_4b8 +
                      fStack_1218 * fStack_4f8 +
                      fStack_11b8 * fStack_538 +
                      fStack_1158 * fStack_578 +
                      fStack_10f8 * fStack_5b8 +
                      fStack_1098 * fStack_5f8 +
                      fStack_1038 * fStack_638 + fStack_fd8 * fStack_678 + fStack_cb8);
        local_1b00[2] =
             CONCAT44(fStack_18cc * fStack_6c +
                      fStack_186c * fStack_ac +
                      fStack_180c * fStack_ec +
                      fStack_17ac * fStack_12c +
                      fStack_174c * fStack_16c +
                      fStack_16ec * fStack_1ac +
                      fStack_168c * fStack_1ec +
                      fStack_162c * fStack_22c +
                      fStack_15cc * fStack_26c +
                      fStack_156c * fStack_2ac +
                      fStack_150c * fStack_2ec +
                      fStack_14ac * fStack_32c +
                      fStack_144c * fStack_36c +
                      fStack_13ec * fStack_3ac +
                      fStack_138c * fStack_3ec +
                      fStack_132c * fStack_42c +
                      fStack_12cc * fStack_46c +
                      fStack_126c * fStack_4ac +
                      fStack_120c * fStack_4ec +
                      fStack_11ac * fStack_52c +
                      fStack_114c * fStack_56c +
                      fStack_10ec * fStack_5ac +
                      fStack_108c * fStack_5ec +
                      fStack_102c * fStack_62c + fStack_fcc * fStack_66c + fStack_cac,
                      fStack_18d0 * fStack_70 +
                      fStack_1870 * fStack_b0 +
                      fStack_1810 * fStack_f0 +
                      fStack_17b0 * fStack_130 +
                      fStack_1750 * fStack_170 +
                      fStack_16f0 * fStack_1b0 +
                      fStack_1690 * fStack_1f0 +
                      fStack_1630 * fStack_230 +
                      fStack_15d0 * fStack_270 +
                      fStack_1570 * fStack_2b0 +
                      fStack_1510 * fStack_2f0 +
                      fStack_14b0 * fStack_330 +
                      fStack_1450 * fStack_370 +
                      fStack_13f0 * fStack_3b0 +
                      fStack_1390 * fStack_3f0 +
                      fStack_1330 * fStack_430 +
                      fStack_12d0 * fStack_470 +
                      fStack_1270 * fStack_4b0 +
                      fStack_1210 * fStack_4f0 +
                      fStack_11b0 * fStack_530 +
                      fStack_1150 * fStack_570 +
                      fStack_10f0 * fStack_5b0 +
                      fStack_1090 * fStack_5f0 +
                      fStack_1030 * fStack_630 + fStack_fd0 * fStack_670 + fStack_cb0);
        local_1b00[3] =
             CONCAT44(fStack_18c4 +
                      fStack_1864 +
                      fStack_1804 +
                      fStack_17a4 +
                      fStack_1744 +
                      fStack_16e4 +
                      fStack_1684 +
                      fStack_1624 +
                      fStack_15c4 +
                      fStack_1564 +
                      fStack_1504 +
                      fStack_14a4 +
                      fStack_1444 +
                      fStack_13e4 +
                      fStack_1384 +
                      fStack_1324 +
                      fStack_12c4 +
                      fStack_1264 +
                      fStack_1204 +
                      fStack_11a4 +
                      fStack_1144 +
                      fStack_10e4 + fStack_1084 + fStack_1024 + fStack_fc4 + fStack_ca4,
                      fStack_18c8 * fStack_68 +
                      fStack_1868 * fStack_a8 +
                      fStack_1808 * fStack_e8 +
                      fStack_17a8 * fStack_128 +
                      fStack_1748 * fStack_168 +
                      fStack_16e8 * fStack_1a8 +
                      fStack_1688 * fStack_1e8 +
                      fStack_1628 * fStack_228 +
                      fStack_15c8 * fStack_268 +
                      fStack_1568 * fStack_2a8 +
                      fStack_1508 * fStack_2e8 +
                      fStack_14a8 * fStack_328 +
                      fStack_1448 * fStack_368 +
                      fStack_13e8 * fStack_3a8 +
                      fStack_1388 * fStack_3e8 +
                      fStack_1328 * fStack_428 +
                      fStack_12c8 * fStack_468 +
                      fStack_1268 * fStack_4a8 +
                      fStack_1208 * fStack_4e8 +
                      fStack_11a8 * fStack_528 +
                      fStack_1148 * fStack_568 +
                      fStack_10e8 * fStack_5a8 +
                      fStack_1088 * fStack_5e8 +
                      fStack_1028 * fStack_628 + fStack_fc8 * fStack_668 + fStack_ca8);
        local_1b50 = local_1b50 + 4;
        local_1b58 = local_1b58 + 4;
        local_1b60 = local_1b60 + 4;
        local_1b68 = local_1b68 + 4;
        local_1b70 = local_1b70 + 4;
        local_1b00 = local_1b00 + 4;
      }
      local_1b50 = local_1b50 + 0x10;
      local_1b58 = local_1b58 + 0x10;
      local_1b60 = local_1b60 + 0x10;
      local_1b68 = local_1b68 + 0x10;
      local_1b70 = local_1b70 + 0x10;
    }
  }
  return;
}

Assistant:

static void convdw5x5s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + g * 8) : _mm256_setzero_ps();

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);
        const float* r3 = img0.row(3);
        const float* r4 = img0.row(4);

        int i = 0;
        for (; i < outh; i++)
        {
            int j = 0;

            for (; j < outw; j++)
            {
                __m256 _sum0 = _bias0;

                __m256 _r00 = _mm256_load_ps(r0);
                __m256 _r01 = _mm256_load_ps(r0 + 8);
                __m256 _r02 = _mm256_load_ps(r0 + 16);
                __m256 _r03 = _mm256_load_ps(r0 + 24);
                __m256 _r04 = _mm256_load_ps(r0 + 32);

                __m256 _k00 = _mm256_load_ps(k0);
                __m256 _k01 = _mm256_load_ps(k0 + 8);
                __m256 _k02 = _mm256_load_ps(k0 + 16);
                __m256 _k03 = _mm256_load_ps(k0 + 24);
                __m256 _k04 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);

                __m256 _r10 = _mm256_load_ps(r1);
                __m256 _r11 = _mm256_load_ps(r1 + 8);
                __m256 _r12 = _mm256_load_ps(r1 + 16);
                __m256 _r13 = _mm256_load_ps(r1 + 24);
                __m256 _r14 = _mm256_load_ps(r1 + 32);

                __m256 _k10 = _mm256_load_ps(k0);
                __m256 _k11 = _mm256_load_ps(k0 + 8);
                __m256 _k12 = _mm256_load_ps(k0 + 16);
                __m256 _k13 = _mm256_load_ps(k0 + 24);
                __m256 _k14 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);

                __m256 _r20 = _mm256_load_ps(r2);
                __m256 _r21 = _mm256_load_ps(r2 + 8);
                __m256 _r22 = _mm256_load_ps(r2 + 16);
                __m256 _r23 = _mm256_load_ps(r2 + 24);
                __m256 _r24 = _mm256_load_ps(r2 + 32);

                __m256 _k20 = _mm256_load_ps(k0);
                __m256 _k21 = _mm256_load_ps(k0 + 8);
                __m256 _k22 = _mm256_load_ps(k0 + 16);
                __m256 _k23 = _mm256_load_ps(k0 + 24);
                __m256 _k24 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k22, _r22, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k23, _r23, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k24, _r24, _sum0);

                __m256 _r30 = _mm256_load_ps(r3);
                __m256 _r31 = _mm256_load_ps(r3 + 8);
                __m256 _r32 = _mm256_load_ps(r3 + 16);
                __m256 _r33 = _mm256_load_ps(r3 + 24);
                __m256 _r34 = _mm256_load_ps(r3 + 32);

                __m256 _k30 = _mm256_load_ps(k0);
                __m256 _k31 = _mm256_load_ps(k0 + 8);
                __m256 _k32 = _mm256_load_ps(k0 + 16);
                __m256 _k33 = _mm256_load_ps(k0 + 24);
                __m256 _k34 = _mm256_load_ps(k0 + 32);
                k0 += 40;

                _sum0 = _mm256_comp_fmadd_ps(_k30, _r30, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k31, _r31, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k32, _r32, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k33, _r33, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k34, _r34, _sum0);

                __m256 _r40 = _mm256_load_ps(r4);
                __m256 _r41 = _mm256_load_ps(r4 + 8);
                __m256 _r42 = _mm256_load_ps(r4 + 16);
                __m256 _r43 = _mm256_load_ps(r4 + 24);
                __m256 _r44 = _mm256_load_ps(r4 + 32);

                __m256 _k40 = _mm256_load_ps(k0);
                __m256 _k41 = _mm256_load_ps(k0 + 8);
                __m256 _k42 = _mm256_load_ps(k0 + 16);
                __m256 _k43 = _mm256_load_ps(k0 + 24);
                __m256 _k44 = _mm256_load_ps(k0 + 32);
                k0 -= 160;

                _sum0 = _mm256_comp_fmadd_ps(_k40, _r40, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k41, _r41, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k42, _r42, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k43, _r43, _sum0);
                _sum0 = _mm256_comp_fmadd_ps(_k44, _r44, _sum0);

                _mm256_store_ps(outptr0, _sum0);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                r3 += 8;
                r4 += 8;
                outptr0 += 8;
            }

            r0 += 4 * 8;
            r1 += 4 * 8;
            r2 += 4 * 8;
            r3 += 4 * 8;
            r4 += 4 * 8;
        }
    }
}